

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType(UniformType *this,UniformType *param_1)

{
  pointer pcVar1;
  pair<int,_int> pVar2;
  
  this->enumType = param_1->enumType;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->arraySizesSegmented,&param_1->arraySizesSegmented);
  this->arraySize = param_1->arraySize;
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&this->childTypes,&param_1->childTypes);
  (this->strType)._M_dataplus._M_p = (pointer)&(this->strType).field_2;
  pcVar1 = (param_1->strType)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->strType,pcVar1,pcVar1 + (param_1->strType)._M_string_length);
  (this->refStrType)._M_dataplus._M_p = (pointer)&(this->refStrType).field_2;
  pcVar1 = (param_1->refStrType)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->refStrType,pcVar1,pcVar1 + (param_1->refStrType)._M_string_length);
  pVar2 = param_1->size;
  *(undefined8 *)((long)&(this->size).second + 2) =
       *(undefined8 *)((long)&(param_1->size).second + 2);
  this->size = pVar2;
  return;
}

Assistant:

UniformType(GLenum _enumType, int _arraySize = 0)
		: enumType(_enumType), arraySize(_arraySize), isArray(_arraySize > 0), signedType(true)
	{
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
		fill();
	}